

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O0

void __thiscall
pbrt::ProgressReporter::ProgressReporter
          (ProgressReporter *this,int64_t totalWork,string *title,bool quiet,bool gpu)

{
  long *plVar1;
  undefined1 in_CL;
  string *in_RDX;
  undefined8 in_RSI;
  type *in_RDI;
  undefined1 in_R8B;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Timer *in_stack_ffffffffffffff90;
  thread *this_00;
  optional<float> *this_01;
  thread *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffd0) [13];
  char *fmt;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar2;
  string *file;
  LogLevel level;
  
  level = (LogLevel)((ulong)in_RSI >> 0x20);
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  uVar2 = CONCAT13((char)(uVar2 >> 0x18),CONCAT12(in_R8B,(short)uVar2)) & 0xff01ffff;
  fmt = (char *)0x1;
  file = in_RDX;
  plVar1 = std::max<long>((long *)&stack0xffffffffffffffd8,(long *)&stack0xfffffffffffffff0);
  in_RDI->this = (ProgressReporter *)*plVar1;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  *(byte *)&in_RDI[5].this = (byte)(uVar2 >> 0x18) & 1;
  Timer::Timer(in_stack_ffffffffffffff90);
  this_00 = (thread *)(in_RDI + 9);
  std::thread::thread((thread *)0xa2c534);
  this_01 = (optional<float> *)(in_RDI + 10);
  pstd::optional<float>::optional(this_01);
  std::__atomic_base<long>::operator=((__atomic_base<long> *)in_RDX,(__int_type_conflict3)this_01);
  std::atomic<bool>::operator=((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffff8f);
  if ((uVar2 & 0x10000) != 0) {
    LogFatal<char_const(&)[13]>(level,(char *)file,uVar2,fmt,in_stack_ffffffffffffffd0);
  }
  if ((uVar2 & 0x1000000) == 0) {
    std::thread::
    thread<pbrt::ProgressReporter::ProgressReporter(long,std::__cxx11::string,bool,bool)::__0,,void>
              (in_stack_ffffffffffffffc0,in_RDI);
    std::thread::operator=
              (this_00,(thread *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::thread::~thread((thread *)0xa2c610);
  }
  return;
}

Assistant:

ProgressReporter::ProgressReporter(int64_t totalWork, std::string title, bool quiet,
                                   bool gpu)
    : totalWork(std::max<int64_t>(1, totalWork)), title(title), quiet(quiet) {
    workDone = 0;
    exitThread = false;

#ifdef PBRT_BUILD_GPU_RENDERER
    if (gpu) {
        gpuEventsLaunchedOffset = 0;
        gpuEventsFinishedOffset = 0;

        gpuEvents.resize(totalWork);
        for (cudaEvent_t &event : gpuEvents)
            CUDA_CHECK(cudaEventCreate(&event));
    }
#else
    CHECK(gpu == false);
#endif

    // Launch thread to periodically update progress bar
    if (!quiet) {
        updateThread = std::thread([this]() {
#ifdef PBRT_BUILD_GPU_RENDERER
            GPURegisterThread("PBRT_PROGRESS_BAR");
#endif
            printBar();
        });
    }
}